

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

BOOL JS_IsCFunction(JSContext *ctx,JSValue val,JSCFunction *func,int magic)

{
  JSValueUnion JVar1;
  undefined1 local_39;
  JSObject *p;
  int magic_local;
  JSCFunction *func_local;
  JSContext *ctx_local;
  JSValue val_local;
  undefined4 local_4;
  
  JVar1 = val.u;
  if ((int)val.tag == -1) {
    if (*(short *)((long)JVar1.ptr + 6) == 0xc) {
      local_39 = false;
      if (*(JSCFunction **)((long)JVar1.ptr + 0x38) == func) {
        local_39 = *(short *)((long)JVar1.ptr + 0x42) == magic;
      }
      local_4 = (uint)local_39;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

BOOL JS_IsCFunction(JSContext *ctx, JSValueConst val, JSCFunction *func, int magic)
{
    JSObject *p;
    if (JS_VALUE_GET_TAG(val) != JS_TAG_OBJECT)
        return FALSE;
    p = JS_VALUE_GET_OBJ(val);
    if (p->class_id == JS_CLASS_C_FUNCTION)
        return (p->u.cfunc.c_function.generic == func && p->u.cfunc.magic == magic);
    else
        return FALSE;
}